

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space2.cpp
# Opt level: O2

int bomb_destroy_ship_proc(Am_Object *self)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Am_Value *pAVar11;
  ushort uVar12;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  
  Am_Object::Get_Owner(&local_38,(Am_Slot_Flags)self);
  cVar1 = Am_Object::Valid();
  Am_Object::~Am_Object(&local_38);
  if (cVar1 != '\0') {
    uVar12 = (ushort)self;
    pAVar11 = (Am_Value *)Am_Object::Get(uVar12,0x69);
    bVar2 = Am_Value::operator_cast_to_bool(pAVar11);
    if (bVar2) {
      pAVar11 = (Am_Value *)Am_Object::Get(uVar12,0x65);
      iVar3 = Am_Value::operator_cast_to_int(pAVar11);
      pAVar11 = (Am_Value *)Am_Object::Get(uVar12,0x67);
      iVar4 = Am_Value::operator_cast_to_int(pAVar11);
      pAVar11 = (Am_Value *)Am_Object::Get(uVar12,100);
      iVar5 = Am_Value::operator_cast_to_int(pAVar11);
      pAVar11 = (Am_Value *)Am_Object::Get(uVar12,0x66);
      iVar6 = Am_Value::operator_cast_to_int(pAVar11);
      pAVar11 = (Am_Value *)Am_Object::Get(0x92d0,100);
      iVar7 = Am_Value::operator_cast_to_int(pAVar11);
      pAVar11 = (Am_Value *)Am_Object::Get(0x92d0,0x65);
      iVar8 = Am_Value::operator_cast_to_int(pAVar11);
      pAVar11 = (Am_Value *)Am_Object::Get(0x92d0,0x66);
      iVar9 = Am_Value::operator_cast_to_int(pAVar11);
      pAVar11 = (Am_Value *)Am_Object::Get(0x92d0,0x67);
      iVar10 = Am_Value::operator_cast_to_int(pAVar11);
      if (((iVar5 <= iVar9 + iVar7 && iVar7 <= iVar5) ||
          (iVar6 + iVar5 <= iVar9 + iVar7 && iVar7 <= iVar6 + iVar5)) &&
         ((iVar8 <= iVar3 && iVar3 <= iVar10 + iVar8 ||
          (iVar8 <= iVar4 + iVar3 && iVar4 + iVar3 <= iVar10 + iVar8)))) {
        Am_Object::Set(0x92d0,true,0);
        Am_Object::Set(uVar12,true,0);
        Am_Object::Am_Object(&local_40,self);
        blot_bomb(&local_40);
        Am_Object::~Am_Object(&local_40);
        Am_Object::Am_Object(&local_48,&alien_animator);
        Am_Stop_Animator((Am_Object_Data *)&local_48);
        Am_Object::~Am_Object(&local_48);
        Am_Object::Am_Object(&local_50,&star_animator);
        Am_Stop_Animator((Am_Object_Data *)&local_50);
        Am_Object::~Am_Object(&local_50);
      }
    }
  }
  return 0;
}

Assistant:

Am_Define_Formula(int, bomb_destroy_ship) // in the bomb, not its group
{
  if (!self.Get_Owner().Valid())
    return 0;
  if (!(bool)self.Get(Am_VISIBLE))
    return 0;

  int bomb_top = (int)self.Get(Am_TOP);
  int bomb_bottom = bomb_top + (int)self.Get(Am_HEIGHT);
  int bomb_left = (int)self.Get(Am_LEFT);
  int bomb_right = bomb_left + (int)self.Get(Am_WIDTH);
  int ship_left = (int)Ship.Get(Am_LEFT);
  int ship_top = (int)Ship.Get(Am_TOP);
  int ship_right = ship_left + (int)Ship.Get(Am_WIDTH);
  int ship_bottom = ship_top + (int)Ship.Get(Am_HEIGHT);
  if (((bomb_left >= ship_left && bomb_left <= ship_right) ||
       (bomb_right >= ship_left && bomb_right <= ship_right)) &&
      ((bomb_top <= ship_bottom && bomb_top >= ship_top) ||
       (bomb_bottom <= ship_bottom && bomb_bottom >= ship_top))) {
    Ship.Set(Am_VISIBLE, false);
    self.Set(Am_VISIBLE, false);
    blot_bomb(self);
    Am_Stop_Animator(alien_animator);
    Am_Stop_Animator(star_animator);
  }
  return 0;
}